

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

ENetPeer * enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,uint32_t data)

{
  uint8_t uVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ENetChannel *pEVar11;
  ENetOutgoingCommand *outgoingCommand;
  ENetPeer *pEVar12;
  uint uVar13;
  uint32_t *puVar14;
  uint32_t uVar15;
  size_t sVar16;
  
  sVar10 = 0xff;
  if (channelCount < 0xff) {
    sVar10 = channelCount;
  }
  sVar16 = 1;
  if (channelCount != 0) {
    sVar16 = sVar10;
  }
  if (0 < (long)host->peerCount) {
    puVar14 = &host->peers->windowSize;
    do {
      if (puVar14[-0x2d] == ENET_PEER_STATE_DISCONNECTED) {
        pEVar11 = (ENetChannel *)(*(code *)callbacks_0)(sVar16 * 0x50);
        if (pEVar11 == (ENetChannel *)0x0) {
          pEVar12 = (ENetPeer *)(*(code *)callbacks_2)();
          return pEVar12;
        }
        *(ENetChannel **)(puVar14 + -0x2b) = pEVar11;
        *(size_t *)(puVar14 + -0x29) = sVar16;
        puVar14[-0x2d] = ENET_PEER_STATE_CONNECTING;
        uVar4 = *(uint *)((long)&address->field_0 + 4);
        uVar13 = *(uint *)((long)&address->field_0 + 8);
        uVar5 = (address->field_0).ipv4.ip.s_addr;
        *(uint *)&((ENetAddress *)(puVar14 + -0x34))->field_0 = *(uint *)&address->field_0;
        puVar14[-0x33] = uVar4;
        puVar14[-0x32] = uVar13;
        puVar14[-0x31] = uVar5;
        puVar14[-0x30] = *(uint *)&address->port;
        uVar15 = host->randomSeed + 1;
        host->randomSeed = uVar15;
        puVar14[-0x36] = uVar15;
        uVar4 = host->outgoingBandwidth;
        if (uVar4 != 0) {
          uVar13 = uVar4 >> 4 & 0xffff000;
          *puVar14 = uVar13;
          if (uVar13 == 0) {
            *puVar14 = 0x1000;
            uVar13 = 0x1000;
            goto LAB_00107363;
          }
          if (uVar13 < 0x10001) goto LAB_00107363;
        }
        *puVar14 = 0x10000;
        uVar13 = 0x10000;
LAB_00107363:
        if (sVar16 != 0) {
          do {
            pEVar11->outgoingReliableSequenceNumber = 0;
            pEVar11->outgoingUnreliableSequenceNumber = 0;
            pEVar11->incomingUnreliableSequenceNumber = 0;
            (pEVar11->incomingReliableCommands).sentinel.next =
                 &(pEVar11->incomingReliableCommands).sentinel;
            (pEVar11->incomingReliableCommands).sentinel.previous =
                 &(pEVar11->incomingReliableCommands).sentinel;
            (pEVar11->incomingUnreliableCommands).sentinel.next =
                 &(pEVar11->incomingUnreliableCommands).sentinel;
            (pEVar11->incomingUnreliableCommands).sentinel.previous =
                 &(pEVar11->incomingUnreliableCommands).sentinel;
            pEVar11->usedReliableWindows = 0;
            pEVar11->reliableWindows[0] = 0;
            pEVar11->reliableWindows[1] = 0;
            pEVar11->reliableWindows[2] = 0;
            pEVar11->reliableWindows[3] = 0;
            pEVar11->reliableWindows[4] = 0;
            pEVar11->reliableWindows[5] = 0;
            pEVar11->reliableWindows[6] = 0;
            pEVar11->reliableWindows[7] = 0;
            pEVar11->reliableWindows[8] = 0;
            pEVar11->reliableWindows[9] = 0;
            pEVar11->reliableWindows[10] = 0;
            pEVar11->reliableWindows[0xb] = 0;
            pEVar11->reliableWindows[0xc] = 0;
            pEVar11->reliableWindows[0xd] = 0;
            pEVar11->reliableWindows[0xe] = 0;
            *(undefined4 *)(pEVar11->reliableWindows + 0xf) = 0;
            pEVar11 = pEVar11 + 1;
          } while (pEVar11 < *(ENetChannel **)(puVar14 + -0x2b) + sVar16);
          uVar15 = puVar14[-0x36];
          uVar13 = *puVar14;
          uVar4 = host->outgoingBandwidth;
        }
        uVar3 = *(uint16_t *)((long)puVar14 + -0xda);
        uVar1 = *(uint8_t *)((long)puVar14 + -0xd3);
        uVar2 = *(uint8_t *)(puVar14 + -0x35);
        uVar5 = puVar14[-1];
        uVar6 = host->incomingBandwidth;
        uVar7 = puVar14[-0xc];
        uVar8 = puVar14[-0xe];
        uVar9 = puVar14[-0xd];
        outgoingCommand = (ENetOutgoingCommand *)(*(code *)callbacks_0)(0x60);
        if (outgoingCommand == (ENetOutgoingCommand *)0x0) {
          pEVar12 = (ENetPeer *)(*(code *)callbacks_2)();
          return pEVar12;
        }
        *(undefined2 *)&outgoingCommand->command = 0xff82;
        (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber =
             uVar3 << 8 | uVar3 >> 8;
        (outgoingCommand->command).connect.incomingSessionID = uVar1;
        (outgoingCommand->command).connect.outgoingSessionID = uVar2;
        (outgoingCommand->command).connect.mtu =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        (outgoingCommand->command).connect.windowSize =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        (outgoingCommand->command).connect.channelCount = (int)sVar16 << 0x18;
        (outgoingCommand->command).connect.incomingBandwidth =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        (outgoingCommand->command).connect.outgoingBandwidth =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        (outgoingCommand->command).connect.packetThrottleInterval =
             uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        (outgoingCommand->command).connect.packetThrottleAcceleration =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        (outgoingCommand->command).connect.packetThrottleDeceleration =
             uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        (outgoingCommand->command).connect.connectID = uVar15;
        (outgoingCommand->command).connect.data =
             data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
        outgoingCommand->fragmentOffset = 0;
        outgoingCommand->fragmentLength = 0;
        outgoingCommand->packet = (ENetPacket *)0x0;
        enet_peer_setup_outgoing_command((ENetPeer *)(puVar14 + -0x3d),outgoingCommand);
        return (ENetPeer *)(puVar14 + -0x3d);
      }
      pEVar12 = (ENetPeer *)(puVar14 + 0x3d);
      puVar14 = puVar14 + 0x7a;
    } while (pEVar12 < host->peers + host->peerCount);
  }
  return (ENetPeer *)0x0;
}

Assistant:

ENetPeer* enet_host_connect(ENetHost* host, const ENetAddress* address, size_t channelCount, uint32_t data) {
	ENET_LOG_TRACE("A ENet Host is trying to establish a connection.");

	ENetPeer* currentPeer;
	ENetChannel* channel;
	ENetProtocol command;

	if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
	else if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED)
			break;
	}

	if (currentPeer >= &host->peers[host->peerCount])
		return NULL;

	currentPeer->channels = (ENetChannel*)enet_malloc(channelCount * sizeof(ENetChannel));

	if (currentPeer->channels == NULL)
		return NULL;

	currentPeer->channelCount = channelCount;
	currentPeer->state = ENET_PEER_STATE_CONNECTING;
	currentPeer->address = *address;
	currentPeer->connectID = ++host->randomSeed;

	if (host->outgoingBandwidth == 0)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
	else
		currentPeer->windowSize = (host->outgoingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

	if (currentPeer->windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
	else if (currentPeer->windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

	for (channel = currentPeer->channels; channel < &currentPeer->channels[channelCount]; ++channel) {
		channel->outgoingReliableSequenceNumber = 0;
		channel->outgoingUnreliableSequenceNumber = 0;
		channel->incomingReliableSequenceNumber = 0;
		channel->incomingUnreliableSequenceNumber = 0;

		enet_list_clear(&channel->incomingReliableCommands);
		enet_list_clear(&channel->incomingUnreliableCommands);

		channel->usedReliableWindows = 0;

		memset(channel->reliableWindows, 0, sizeof(channel->reliableWindows));
	}

	command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
	command.header.channelID = 0xFF;
	command.connect.outgoingPeerID = ENET_HOST_TO_NET_16(currentPeer->incomingPeerID);
	command.connect.incomingSessionID = currentPeer->incomingSessionID;
	command.connect.outgoingSessionID = currentPeer->outgoingSessionID;
	command.connect.mtu = ENET_HOST_TO_NET_32(currentPeer->mtu);
	command.connect.windowSize = ENET_HOST_TO_NET_32(currentPeer->windowSize);
	command.connect.channelCount = ENET_HOST_TO_NET_32(channelCount);
	command.connect.incomingBandwidth = ENET_HOST_TO_NET_32(host->incomingBandwidth);
	command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32(host->outgoingBandwidth);
	command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32(currentPeer->packetThrottleInterval);
	command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleAcceleration);
	command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleDeceleration);
	command.connect.connectID = currentPeer->connectID;
	command.connect.data = ENET_HOST_TO_NET_32(data);

	enet_peer_queue_outgoing_command(currentPeer, &command, NULL, 0, 0);

	return currentPeer;
}